

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_folding.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_6ff2e::ir_constant_folding_visitor::visit_enter
          (ir_constant_folding_visitor *this,ir_discard *ir)

{
  ir_constant *piVar1;
  ir_rvalue **__filename;
  ir_constant *const_val;
  ir_discard *ir_local;
  ir_constant_folding_visitor *this_local;
  
  if (ir->condition != (ir_rvalue *)0x0) {
    (*(ir->condition->super_ir_instruction)._vptr_ir_instruction[3])(ir->condition,this);
    __filename = &ir->condition;
    (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
      _vptr_ir_hierarchical_visitor[0x28])();
    piVar1 = ir_instruction::as_constant(&ir->condition->super_ir_instruction);
    if (piVar1 != (ir_constant *)0x0) {
      if (((piVar1->value).b[0] & 1U) == 0) {
        exec_node::remove(&(ir->super_ir_jump).super_ir_instruction.super_exec_node,
                          (char *)__filename);
      }
      else {
        ir->condition = (ir_rvalue *)0x0;
      }
      (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
      field_0x31 = 1;
    }
  }
  return visit_continue_with_parent;
}

Assistant:

ir_visitor_status
ir_constant_folding_visitor::visit_enter(ir_discard *ir)
{
   if (ir->condition) {
      ir->condition->accept(this);
      handle_rvalue(&ir->condition);

      ir_constant *const_val = ir->condition->as_constant();
      /* If the condition is constant, either remove the condition or
       * remove the never-executed assignment.
       */
      if (const_val) {
         if (const_val->value.b[0])
            ir->condition = NULL;
         else
            ir->remove();
         this->progress = true;
      }
   }

   return visit_continue_with_parent;
}